

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O2

string_view __thiscall
cinatra::coro_http_request::get_header_value(coro_http_request *this,string_view key)

{
  http_parser *phVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  iterator __begin2;
  array<cinatra::http_header,_100UL> *paVar6;
  string_view sVar7;
  
  phVar1 = this->parser_;
  paVar6 = &phVar1->headers_;
  sVar3 = phVar1->num_headers_;
  lVar5 = 0;
  do {
    if (sVar3 << 5 == lVar5) {
      sVar3 = 0;
      pcVar4 = (char *)0x0;
LAB_0011f7a7:
      sVar7._M_str = pcVar4;
      sVar7._M_len = sVar3;
      return sVar7;
    }
    pcVar4 = paVar6->_M_elems[0].name._M_str;
    bVar2 = std::
            __equal4<char_const*,char_const*,cinatra::iequal0(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::_lambda(char,char)_1_>
                      (pcVar4,pcVar4 + paVar6->_M_elems[0].name._M_len,key._M_str,
                       key._M_str + key._M_len);
    if (bVar2) {
      sVar3 = *(size_t *)((long)&(phVar1->headers_)._M_elems[0].value._M_len + lVar5);
      pcVar4 = *(char **)((long)&(phVar1->headers_)._M_elems[0].value._M_str + lVar5);
      goto LAB_0011f7a7;
    }
    paVar6 = (array<cinatra::http_header,_100UL> *)(paVar6->_M_elems + 1);
    lVar5 = lVar5 + 0x20;
  } while( true );
}

Assistant:

std::string_view get_header_value(std::string_view key) {
    auto headers = parser_.get_headers();
    for (auto &header : headers) {
      if (iequal0(header.name, key)) {
        return header.value;
      }
    }

    return {};
  }